

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.h
# Opt level: O1

void __thiscall cfd::core::Extkey::Extkey(Extkey *this,Extkey *param_1)

{
  undefined3 uVar1;
  uint32_t uVar2;
  NetType NVar3;
  
  this->version_ = param_1->version_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->fingerprint_,
             &(param_1->fingerprint_).data_);
  uVar1 = *(undefined3 *)&param_1->field_0x21;
  uVar2 = param_1->child_num_;
  this->depth_ = param_1->depth_;
  *(undefined3 *)&this->field_0x21 = uVar1;
  this->child_num_ = uVar2;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->chaincode_,
             &(param_1->chaincode_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&param_1->privkey_);
  uVar1 = *(undefined3 *)&(param_1->privkey_).field_0x19;
  NVar3 = (param_1->privkey_).net_type_;
  (this->privkey_).is_compressed_ = (param_1->privkey_).is_compressed_;
  *(undefined3 *)&(this->privkey_).field_0x19 = uVar1;
  (this->privkey_).net_type_ = NVar3;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&param_1->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->tweak_sum_,
             &(param_1->tweak_sum_).data_);
  return;
}

Assistant:

class CFD_CORE_EXPORT Extkey {
 public:
  /**
   * @brief bip32 serialize size
   */
  static constexpr uint32_t kSerializeSize = 78;
  /**
   * @brief hardened key definition
   */
  static constexpr uint32_t kHardenedKey = 0x80000000;

  /**
   * @brief create from privkey.
   * @param[in] version             extkey version
   * @param[in] parent_fingerprint  parent fingerprint(4byte)
   * @param[in] privkey             privkey
   * @param[in] chain_code          chain code
   * @param[in] depth               depth
   * @param[in] child_num           child num
   * @param[in] tweak_sum           tweak sum
   * @return Extkey object.
   */
  static Extkey FromPrivkey(
      uint32_t version, const ByteData& parent_fingerprint,
      const Privkey& privkey, const ByteData256& chain_code, uint8_t depth,
      uint32_t child_num, ByteData256 tweak_sum = ByteData256());
  /**
   * @brief create from pubkey.
   * @param[in] version             extkey version
   * @param[in] parent_fingerprint  parent fingerprint(4byte)
   * @param[in] pubkey              pubkey
   * @param[in] chain_code          chain code
   * @param[in] depth               depth
   * @param[in] child_num           child num
   * @param[in] tweak_sum           tweak sum
   * @return Extkey object.
   */
  static Extkey FromPubkey(
      uint32_t version, const ByteData& parent_fingerprint,
      const Pubkey& pubkey, const ByteData256& chain_code, uint8_t depth,
      uint32_t child_num, ByteData256 tweak_sum = ByteData256());

  /**
   * @brief constructor.
   */
  Extkey();
  /**
   * @brief constructor.
   * @param[in] seed          seed byte
   * @param[in] network_type  network type
   * @param[in] format_type   format type
   */
  explicit Extkey(
      const ByteData& seed, NetType network_type = NetType::kMainnet,
      Bip32FormatType format_type = Bip32FormatType::kNormal);
  /**
   * @brief constructor.
   * @param[in] seed            seed byte
   * @param[in] version         extkey version
   */
  explicit Extkey(const ByteData& seed, uint32_t version);
  /**
   * @brief constructor.
   * @param[in] serialize_data  serialize data
   */
  explicit Extkey(const ByteData& serialize_data);
  /**
   * @brief constructor.
   * @param[in] serialize_data  serialize data
   * @param[in] tweak_sum       tweak sum
   */
  explicit Extkey(
      const ByteData& serialize_data, const ByteData256& tweak_sum);
  /**
   * @brief constructor.
   * @param[in] base58_data  base58 data
   */
  explicit Extkey(const std::string& base58_data);
  /**
   * @brief constructor.
   * @param[in] base58_data  base58 data
   * @param[in] tweak_sum    tweak sum
   */
  explicit Extkey(
      const std::string& base58_data, const ByteData256& tweak_sum);

  /**
   * @brief Get Serialize information of extension key.
   * @return serialize data
   */
  ByteData GetData() const;
  /**
   * @brief Get the Base58 string of the extended key.
   * @return base58 string
   */
  std::string ToString() const;

  /**
   * @brief Derive the extended key.
   * @param[in] child_num       child number.
   * @return derived extended key.
   */
  Extkey Derive(uint32_t child_num) const;
  /**
   * @brief Derive the extended key.
   * @param[in] path    child number list.
   * @return derived extended key.
   */
  Extkey Derive(const std::vector<uint32_t>& path) const;
  /**
   * @brief Derive the extended key.
   * @param[in] string_path    child number path.
   * @return derived extended key.
   */
  Extkey Derive(const std::string& string_path) const;
  /**
   * @brief Convert to the extended public key.
   * @return extended key.
   */
  Extkey ToPubkey() const;

  /**
   * @brief Get the related pubkey address.
   * @details This function is returns the Bip32FormatType or P2WPKH address.
   * @param[in] address_type        address type (auto is witnessUnknown)
   * @param[in] network_parameters  network parameter. (nullptr is bitcoin)
   * @param[in] net_type            network type (auto is kCustomChain)
   * @return address.
   */
  Address GetPubkeyAddress(
      AddressType address_type = AddressType::kWitnessUnknown,
      const std::vector<AddressFormatData>* network_parameters = nullptr,
      NetType net_type = NetType::kCustomChain);
  /**
   * @brief Get related pubkey address list.
   * @details If the Bip32FormatType isn't Normal, return the target type only.
   * @param[in] network_parameters  network parameter. (nullptr is bitcoin)
   * @param[in] net_type            network type (auto is kCustomChain)
   * @return address list.
   */
  std::vector<Address> GetPubkeyAddresses(
      const std::vector<AddressFormatData>* network_parameters = nullptr,
      NetType net_type = NetType::kCustomChain);

  /**
   * @brief Check if the data format is correct.
   * @retval true  valid
   * @retval false invalid
   */
  bool IsValid() const;

  /**
   * @brief Check if the data format is extended private key.
   * @retval true   private key
   * @retval false  public key
   */
  bool HasPrivkey() const;

  /**
   * @brief Get depth.
   * @return depth value
   */
  uint8_t GetDepth() const;
  /**
   * @brief Get veresion.
   * @return version data (4byte)
   */
  uint32_t GetVersion() const;
  /**
   * @brief Get veresion.
   * @return version data (4byte)
   */
  ByteData GetVersionData() const;
  /**
   * @brief Get child number.
   * @return child number (4byte)
   */
  uint32_t GetChildNum() const;
  /**
   * @brief Get chain code.
   * @return chain code (32byte)
   */
  ByteData256 GetChainCode() const;
  /**
   * @brief Get fingerprint.
   * @return fingerprint data (4byte)
   */
  uint32_t GetFingerprint() const;
  /**
   * @brief Get fingerprint.
   * @return fingerprint data (4byte)
   */
  ByteData GetFingerprintData() const;

  /**
   * @brief Get pubkey.
   * @return Pubkey
   */
  Pubkey GetPubkey() const;
  /**
   * @brief Get privkey.
   * @return Privkey
   */
  Privkey GetPrivkey() const;
  /**
   * @brief Get the composite value of the tweak value generated in the process of generating the derived Pubkey.
   * @return tweak sum
   */
  ByteData256 GetPubTweakSum() const;
  /**
   * @brief Get network type.
   * @return network type.
   */
  NetType GetNetworkType() const;
  /**
   * @brief Has mainnet key.
   * @retval true   mainnet
   * @retval flse   testnet
   */
  bool HasMainnetKey() const;
  /**
   * @brief Get bip32 format type.
   * @return bip32 format type.
   */
  Bip32FormatType GetFormatType() const;

 protected:
  uint32_t version_ = 0;    //!< version
  ByteData fingerprint_;    //!< finger print
  uint8_t depth_ = 0;       //!< depth
  uint32_t child_num_ = 0;  //!< child number
  ByteData256 chaincode_;   //!< chain code
  Privkey privkey_;         //!< private key
  Pubkey pubkey_;           //!< public key
  ByteData256 tweak_sum_;   //!< tweak sum
}